

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEncoding.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  ostream *poVar2;
  int iVar3;
  string text;
  string encoding;
  ifstream file;
  undefined8 auStack_128 [36];
  
  if (argc < 3) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: testEncoding <encoding> <file>");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar3 = 1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&encoding,argv[1],(allocator<char> *)&file);
    std::ifstream::ifstream(&file,argv[2],_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to open file: ");
      poVar2 = std::operator<<(poVar2,argv[2]);
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar3 = 2;
    }
    else {
      text._M_dataplus._M_p = (pointer)&text.field_2;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&text,*(undefined8 *)((long)auStack_128 + *(long *)(_file + -0x18)),
                 0xffffffffffffffff,0,0xffffffff);
      std::operator<<((ostream *)&std::cout,(string *)&text);
      std::__cxx11::string::~string((string *)&text);
      iVar3 = 0;
    }
    std::ifstream::~ifstream(&file);
    std::__cxx11::string::~string((string *)&encoding);
  }
  return iVar3;
}

Assistant:

int main(int argc, char* argv[])
{
#ifdef _WIN32
  cmsys::ConsoleBuf::Manager consoleOut(std::cout);
#endif
  if (argc <= 2) {
    std::cout << "Usage: testEncoding <encoding> <file>" << std::endl;
    return 1;
  }
  const std::string encoding(argv[1]);
#ifdef _WIN32
  if ((encoding == "UTF8") || (encoding == "UTF-8")) {
    setEncoding(consoleOut, CP_UTF8);
  } else if (encoding == "ANSI") {
    setEncoding(consoleOut, CP_ACP);
  } else if (encoding == "OEM") {
    setEncoding(consoleOut, CP_OEMCP);
  } // else AUTO
#endif
  cmsys::ifstream file(argv[2]);
  if (!file.is_open()) {
    std::cout << "Failed to open file: " << argv[2] << std::endl;
    return 2;
  }
  std::string text((std::istreambuf_iterator<char>(file)),
                   std::istreambuf_iterator<char>());
  std::cout << text;
  return 0;
}